

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O1

void __thiscall
SparseArray_Equal_Test<pstore::uint128>::TestBody(SparseArray_Equal_Test<pstore::uint128> *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  pointer *__ptr;
  char *in_R9;
  unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
  arr2;
  unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
  arr1;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string local_60;
  undefined8 local_40;
  undefined4 local_38;
  
  local_60._M_dataplus._M_p = (pointer)0x0;
  local_60._M_string_length._0_4_ = 0;
  local_60.field_2._M_allocated_capacity = 2;
  local_60.field_2._8_4_ = 2;
  local_40 = 4;
  local_38 = 4;
  pstore::sparse_array<int,pstore::uint128>::make_unique<std::pair<unsigned_long,int>const*>
            ((pair<unsigned_long,_int> *)local_78,(pair<unsigned_long,_int> *)&local_60);
  local_60._M_dataplus._M_p = (char *)0x0;
  local_60._M_string_length._0_4_ = 0;
  local_60.field_2._M_allocated_capacity = 2;
  local_60.field_2._8_4_ = 2;
  local_40 = 4;
  local_38 = 4;
  pstore::sparse_array<int,pstore::uint128>::make_unique<std::pair<unsigned_long,int>const*>
            ((pair<unsigned_long,_int> *)local_88,(pair<unsigned_long,_int> *)&local_60);
  if (*(long *)local_78 == *(long *)local_88._0_8_ &&
      *(long *)((long)local_78 + 8) == *(long *)(local_88._0_8_ + 8)) {
    uVar3 = (ulong)(uint)((int)POPCOUNT(*(long *)((long)local_78 + 8)) << 2);
    uVar2 = (ulong)(uint)((int)POPCOUNT(*(long *)local_78) << 2);
    if (uVar3 == 0 && uVar2 == 0) {
      local_70[0] = (internal)0x1;
    }
    else {
      iVar1 = bcmp((long *)((long)local_78 + 0x10),(long *)(local_88._0_8_ + 0x10),uVar3 + uVar2);
      local_70[0] = (internal)(iVar1 == 0);
    }
  }
  else {
    local_70[0] = (internal)0x0;
  }
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,local_70,(AssertionResult *)"*arr1 == *arr2","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_88 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0xf7,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_88 + 8),(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_88 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  if ((long *)local_88._0_8_ != (long *)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78);
  }
  return;
}

Assistant:

TYPED_TEST (SparseArray, Equal) {
    auto arr1 = sparse_array<int, TypeParam>::make_unique ({{0, 0}, {2, 2}, {4, 4}});
    auto arr2 = sparse_array<int, TypeParam>::make_unique ({{0, 0}, {2, 2}, {4, 4}});
    EXPECT_TRUE (*arr1 == *arr2);
}